

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile.cpp
# Opt level: O2

bool __thiscall FlatFileSeq::Flush(FlatFileSeq *this,FlatFilePos *pos,bool finalize)

{
  bool bVar1;
  FILE *__stream;
  char *fmt;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  int source_line;
  FlatFilePos local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.nFile = pos->nFile;
  local_30.nPos = 0;
  __stream = (FILE *)Open(this,&local_30,false);
  if (__stream == (FILE *)0x0) {
    fmt = "%s: failed to open file %d\n";
    source_line = 0x55;
  }
  else {
    if (finalize) {
      bVar1 = TruncateFile((FILE *)__stream,pos->nPos);
      if (!bVar1) {
        fclose(__stream);
        fmt = "%s: failed to truncate file %d\n";
        source_line = 0x5a;
        goto LAB_006c4f48;
      }
    }
    bVar1 = FileCommit((FILE *)__stream);
    if (bVar1) {
      DirectoryCommit(&this->m_dir);
      fclose(__stream);
      bVar1 = true;
      goto LAB_006c4f5e;
    }
    fclose(__stream);
    fmt = "%s: failed to commit file %d\n";
    source_line = 0x5f;
  }
LAB_006c4f48:
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/flatfile.cpp"
  ;
  source_file._M_len = 0x5c;
  logging_function._M_str = "Flush";
  logging_function._M_len = 5;
  LogPrintFormatInternal<char[6],int>
            (logging_function,source_file,source_line,ALL,Error,(ConstevalFormatString<2U>)fmt,
             (char (*) [6])0xcd1a5f,&pos->nFile);
  bVar1 = false;
LAB_006c4f5e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool FlatFileSeq::Flush(const FlatFilePos& pos, bool finalize) const
{
    FILE* file = Open(FlatFilePos(pos.nFile, 0)); // Avoid fseek to nPos
    if (!file) {
        LogError("%s: failed to open file %d\n", __func__, pos.nFile);
        return false;
    }
    if (finalize && !TruncateFile(file, pos.nPos)) {
        fclose(file);
        LogError("%s: failed to truncate file %d\n", __func__, pos.nFile);
        return false;
    }
    if (!FileCommit(file)) {
        fclose(file);
        LogError("%s: failed to commit file %d\n", __func__, pos.nFile);
        return false;
    }
    DirectoryCommit(m_dir);

    fclose(file);
    return true;
}